

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O0

void __thiscall
mario::EPoller::fillActiveChannels(EPoller *this,int numEvents,ChannelList *activeChannels)

{
  Channel *this_00;
  const_reference pvVar1;
  Channel *local_30;
  Channel *channel;
  ChannelList *pCStack_20;
  int i;
  ChannelList *activeChannels_local;
  EPoller *pEStack_10;
  int numEvents_local;
  EPoller *this_local;
  
  pCStack_20 = activeChannels;
  activeChannels_local._4_4_ = numEvents;
  pEStack_10 = this;
  for (channel._4_4_ = 0; channel._4_4_ < activeChannels_local._4_4_;
      channel._4_4_ = channel._4_4_ + 1) {
    pvVar1 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                       (&this->_events,(long)channel._4_4_);
    this_00 = (Channel *)(pvVar1->data).ptr;
    local_30 = this_00;
    pvVar1 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                       (&this->_events,(long)channel._4_4_);
    Channel::setRevents(this_00,pvVar1->events);
    std::vector<mario::Channel_*,_std::allocator<mario::Channel_*>_>::push_back
              (pCStack_20,&local_30);
  }
  return;
}

Assistant:

void EPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const {
    for (int i = 0; i < numEvents; ++i) {
        Channel* channel = static_cast<Channel*>(_events[i].data.ptr);
        channel->setRevents(_events[i].events);
        activeChannels->push_back(channel);
    }
}